

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_crc32.c
# Opt level: O2

uint32_t calculate_crc32c(uint32_t crc32c,uchar *buffer,uint length)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  uVar3 = (ulong)crc32c;
  if (length < 4) {
    for (uVar5 = 0; uVar1 = (uint32_t)uVar3, length != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = (ulong)((uint)(uVar3 >> 8) ^ crc32Table[(byte)(buffer[uVar5] ^ (byte)uVar3)]);
    }
  }
  else {
    uVar4 = (uint)buffer & 3;
    uVar8 = 4 - uVar4;
    for (lVar7 = 0; 4 - uVar4 != (int)lVar7; lVar7 = lVar7 + 1) {
      uVar3 = (ulong)((uint)(uVar3 >> 8) ^ crc32Table[(byte)(buffer[lVar7] ^ (byte)uVar3)]);
    }
    uVar4 = length - uVar8 >> 3;
    puVar6 = (uint *)(buffer + uVar8);
    while (bVar9 = uVar4 != 0, uVar4 = uVar4 - 1, bVar9) {
      uVar2 = (uint)uVar3 ^ *puVar6;
      uVar8 = puVar6[1];
      puVar6 = puVar6 + 2;
      uVar3 = (ulong)(sctp_crc_tableil8_o80[uVar2 >> 8 & 0xff] ^ sctp_crc_tableil8_o88[uVar2 & 0xff]
                      ^ *(uint *)((long)sctp_crc_tableil8_o72 + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
                      sctp_crc_tableil8_o64[uVar2 >> 0x18] ^ sctp_crc_tableil8_o56[uVar8 & 0xff] ^
                      sctp_crc_tableil8_o48[uVar8 >> 8 & 0xff] ^
                      *(uint *)((long)sctp_crc_tableil8_o40 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^
                     crc32Table[uVar8 >> 0x18]);
    }
    for (lVar7 = 0; uVar1 = (uint32_t)uVar3,
        ((byte)((char)length + ((byte)buffer & 3) + 4) & 7) != (uint)lVar7; lVar7 = lVar7 + 1) {
      uVar3 = (ulong)((uint)(uVar3 >> 8) ^
                     crc32Table[(byte)(*(byte *)((long)puVar6 + lVar7) ^ (byte)uVar3)]);
    }
  }
  return uVar1;
}

Assistant:

uint32_t calculate_crc32c(uint32_t crc32c, const unsigned char *buffer,
			  unsigned int length)
{
	if (length < 4)
		return (singletable_crc32c(crc32c, buffer, length));
	else
		return (multitable_crc32c(crc32c, buffer, length));
}